

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

int i2d_ECParameters(EC_KEY *key,uchar **out)

{
  int iVar1;
  undefined1 local_50 [8];
  CBB cbb;
  uint8_t **outp_local;
  EC_KEY *key_local;
  
  cbb.u._24_8_ = out;
  if ((key == (EC_KEY *)0x0) || (*(long *)key == 0)) {
    ERR_put_error(0xf,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                  ,0x1eb);
  }
  else {
    iVar1 = CBB_init((CBB *)local_50,0);
    if ((iVar1 != 0) &&
       (iVar1 = EC_KEY_marshal_curve_name((CBB *)local_50,*(EC_GROUP **)key), iVar1 != 0)) {
      iVar1 = CBB_finish_i2d((CBB *)local_50,(uint8_t **)cbb.u._24_8_);
      return iVar1;
    }
    CBB_cleanup((CBB *)local_50);
  }
  return -1;
}

Assistant:

int i2d_ECParameters(const EC_KEY *key, uint8_t **outp) {
  if (key == NULL || key->group == NULL) {
    OPENSSL_PUT_ERROR(EC, ERR_R_PASSED_NULL_PARAMETER);
    return -1;
  }

  CBB cbb;
  if (!CBB_init(&cbb, 0) ||  //
      !EC_KEY_marshal_curve_name(&cbb, key->group)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}